

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int AF_A_JumpIfTracerCloser
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  int iVar2;
  AActor *target;
  char *__assertion;
  int in_R9D;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (DObject *)(param->field_0).field_1.a;
    bVar1 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (bVar1) {
      target = GC::ReadBarrier<AActor>((AActor **)&this[0xe].GCNext);
      iVar2 = DoJumpIfCloser(target,(VMFrameStack *)param,(VMValue *)(ulong)(uint)numparam,(int)ret,
                             (VMReturn *)(ulong)(uint)numret,in_R9D);
      return iVar2;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x504,
                "int AF_A_JumpIfTracerCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfTracerCloser)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfCloser(self->tracer, VM_ARGS_NAMES);
}